

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O0

void WAsmJs::RegisterSpace::GetTypeDebugName(Types type,char16 *buf,uint bufsize,bool shortName)

{
  char16_t *pcVar1;
  bool shortName_local;
  uint bufsize_local;
  char16 *buf_local;
  Types type_local;
  
  switch(type) {
  case INT32:
    pcVar1 = L"INT32";
    if (shortName) {
      pcVar1 = L"I";
    }
    wcscpy_s(buf,(ulong)bufsize,pcVar1);
    break;
  case INT64:
    pcVar1 = L"INT64";
    if (shortName) {
      pcVar1 = L"L";
    }
    wcscpy_s(buf,(ulong)bufsize,pcVar1);
    break;
  case FLOAT32:
    pcVar1 = L"FLOAT32";
    if (shortName) {
      pcVar1 = L"F";
    }
    wcscpy_s(buf,(ulong)bufsize,pcVar1);
    break;
  case FLOAT64:
    pcVar1 = L"FLOAT64";
    if (shortName) {
      pcVar1 = L"D";
    }
    wcscpy_s(buf,(ulong)bufsize,pcVar1);
    break;
  case SIMD:
    wcscpy_s(buf,(ulong)bufsize,L"SIMD");
    break;
  default:
    wcscpy_s(buf,(ulong)bufsize,L"UNKNOWN");
  }
  return;
}

Assistant:

void RegisterSpace::GetTypeDebugName(Types type, char16* buf, uint bufsize, bool shortName)
    {
        // Since this needs to be done manually for each type, this assert will make sure to not forget to update this if a new type is added
        CompileAssert(LIMIT == 5);

        switch (type)
        {
        case INT32: wcscpy_s(buf, bufsize  , shortName ? _u("I"): _u("INT32")); break;
        case INT64: wcscpy_s(buf, bufsize  , shortName ? _u("L"): _u("INT64")); break;
        case FLOAT32: wcscpy_s(buf, bufsize, shortName ? _u("F"): _u("FLOAT32")); break;
        case FLOAT64: wcscpy_s(buf, bufsize, shortName ? _u("D"): _u("FLOAT64")); break;
        case SIMD: wcscpy_s(buf, bufsize   , _u("SIMD")); break;
        default: wcscpy_s(buf, bufsize     , _u("UNKNOWN")); break;
        }
    }